

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O2

optional<ImageSpec::Origin> __thiscall
ktx::OptionsCreate::parseTexcoordOrigin
          (OptionsCreate *this,ParseResult *args,uint32_t numDimensions,char *argName,
          Reporter *report)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  OptionValue *pOVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  _Optional_payload_base<ImageSpec::Origin> _Var7;
  uint uVar8;
  allocator<char> local_e9;
  char *argName_local;
  uint32_t local_dc;
  smatch sm;
  string_type local_b0;
  regex re;
  string local_70;
  string local_50;
  
  argName_local = argName;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&re,argName,(allocator<char> *)&local_70);
  pOVar5 = cxxopts::ParseResult::operator[](args,(string *)&re);
  sVar1 = pOVar5->m_count;
  std::__cxx11::string::~string((string *)&re);
  if (sVar1 == 0) {
    _Var7._M_payload = (_Storage<ImageSpec::Origin,_true>)0x0;
    _Var7._M_engaged = false;
  }
  else {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&re,"(?:\\b(top|bottom)\\b-)(?:\\b(left)\\b)(?:-\\b(front|back)\\b)?",0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sm,argName,(allocator<char> *)&local_b0);
    pOVar5 = cxxopts::ParseResult::operator[](args,(string *)&sm);
    pbVar6 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar5);
    std::__cxx11::string::string((string *)&local_50,(string *)pbVar6);
    to_lower_copy(&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&sm);
    sm.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sm._M_begin._M_current = (char *)0x0;
    sm.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sm.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__detail::
    __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_70._M_dataplus._M_p,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_70._M_dataplus._M_p + local_70._M_string_length),&sm,&re,0);
    if ((ulong)(((long)sm.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)sm.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) < 4) {
      Reporter::fatal_usage<char_const(&)[64],char_const*&,std::__cxx11::string_const&>
                (report,(char (*) [64])
                        "Invalid or unsupported origin specified as --{} argument: \"{}\".",
                 &argName_local,&local_70);
    }
    if (numDimensions == 3) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_b0,&sm,3);
      std::__cxx11::string::~string((string *)&local_b0);
      if (local_b0._M_string_length == 0) {
        Reporter::fatal_usage<char_const(&)[62],char_const*&>
                  (report,(char (*) [62])
                          "Z origin must be specified in --{} argument for a 3D texture.",
                   &argName_local);
      }
    }
    local_dc = numDimensions;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_b0,&sm,2);
    iVar2 = std::__cxx11::string::compare((char *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_b0,&sm,1);
    iVar3 = std::__cxx11::string::compare((char *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,kCubemap,&local_e9);
    pOVar5 = cxxopts::ParseResult::operator[](args,&local_b0);
    sVar1 = pOVar5->m_count;
    std::__cxx11::string::~string((string *)&local_b0);
    if ((iVar2 != 0 || iVar3 == 0) && (sVar1 != 0)) {
      Reporter::fatal_usage<char_const(&)[46],char_const*&>
                (report,(char (*) [46])"--{} argument must be top-left for a cubemap.",
                 &argName_local);
    }
    uVar8 = 0x1000000;
    if (local_dc == 3) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_b0,&sm,3);
      iVar4 = std::__cxx11::string::compare((char *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      uVar8 = (uint)(iVar4 == 0) << 0x10 | 0x1000000;
    }
    std::
    _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&sm);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&re);
    _Var7 = (_Optional_payload_base<ImageSpec::Origin>)(CONCAT11(iVar3 == 0,iVar2 != 0) | uVar8);
  }
  return (_Optional_base<ImageSpec::Origin,_true,_true>)
         (_Optional_base<ImageSpec::Origin,_true,_true>)_Var7;
}

Assistant:

std::optional<ImageSpec::Origin> parseTexcoordOrigin(cxxopts::ParseResult& args, uint32_t numDimensions, const char* argName, Reporter& report) const {
        std::optional<ImageSpec::Origin> result;
        if (args[argName].count()) {
            // RE to extract origin for each dimension.
            // - Match 0 is whole matching string.
            // - Match 1 is the y origin.
            // - Match 2 is the x origin.
            // - Match 3 is the z origin. Empty string, if not specified.
            // Use raw literal to avoid excess blackslashes
            std::regex re(R"--((?:\b(top|bottom)\b-)(?:\b(left)\b)(?:-\b(front|back)\b)?)--");
            // For when support for right origin and 1d textures is added.
            //               y dimension made optional ꜜ right added ꜜ
            //std::regex re(R"--((?:\b(top|bottom)\b-)?(?:\b(left|right)\b)(?:-\b(front|back)\b)?)--");

            // "auto" here leads to no matching function call for regex_match.
            const std::string& originStr = to_lower_copy(args[argName].as<std::string>());
            std::smatch sm;
            std::regex_match(originStr.begin(), originStr.end(), sm, re);
#if DEBUG_REGEX
              std::cout << "match size: " << sm.size() << '\n';
              for(uint32_t i = 0; i < sm.size(); i++) {
                  std::cout << "match " << i << ": " << "\"" << sm.str(i) << "\"" << '\n';
              }
#endif
            if (sm.empty()) {
                report.fatal_usage("Invalid or unsupported origin specified as --{} argument: \"{}\".", argName, originStr);
            }
            if (numDimensions == 3 && sm.str(3).empty()) {
                report.fatal_usage("Z origin must be specified in --{} argument for a 3D texture.", argName);
            }

            ImageSpec::Origin orig;
            // Remember, compare returns 0 for a match.
            orig.x = sm.str(2).compare("left") ? ImageSpec::Origin::eRight
                                               : ImageSpec::Origin::eLeft;
            orig.y = sm.str(1).compare("bottom") ? ImageSpec::Origin::eTop
                                                 : ImageSpec::Origin::eBottom;
            if (args[kCubemap].count()) {
                if (orig.x != ImageSpec::Origin::eLeft || orig.y != ImageSpec::Origin::eTop) {
                    report.fatal_usage("--{} argument must be top-left for a cubemap.", argName);
                }
            }
            if (numDimensions == 3)
                orig.z = sm.str(3).compare("front") ? ImageSpec::Origin::eFront
                                                    : ImageSpec::Origin::eBack;
            result = std::move(orig);
        }

        return result;
    }